

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::InterlockedResourceAccessHandler::InterlockedResourceAccessHandler
          (InterlockedResourceAccessHandler *this,Compiler *compiler_,uint32_t entry_point_id)

{
  uint32_t local_1c;
  Compiler *pCStack_18;
  uint32_t entry_point_id_local;
  Compiler *compiler__local;
  InterlockedResourceAccessHandler *this_local;
  
  local_1c = entry_point_id;
  pCStack_18 = compiler_;
  compiler__local = (Compiler *)this;
  OpcodeHandler::OpcodeHandler(&this->super_OpcodeHandler);
  (this->super_OpcodeHandler)._vptr_OpcodeHandler =
       (_func_int **)&PTR__InterlockedResourceAccessHandler_00503790;
  this->compiler = pCStack_18;
  this->in_crit_sec = false;
  this->interlock_function_id = 0;
  this->split_function_case = false;
  this->control_flow_interlock = false;
  this->use_critical_section = false;
  this->call_stack_is_interlocked = false;
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->call_stack);
  SmallVector<unsigned_int,_8UL>::push_back(&this->call_stack,&local_1c);
  return;
}

Assistant:

InterlockedResourceAccessHandler(Compiler &compiler_, uint32_t entry_point_id)
		    : compiler(compiler_)
		{
			call_stack.push_back(entry_point_id);
		}